

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O3

handle pybind11::detail::
       list_caster<std::vector<unsigned_short,std::allocator<unsigned_short>>,unsigned_short>::
       cast<std::vector<unsigned_short,std::allocator<unsigned_short>>>
                 (vector<unsigned_short,_std::allocator<unsigned_short>_> *src,
                 return_value_policy policy,handle parent)

{
  pointer puVar1;
  pointer puVar2;
  long lVar3;
  PyObject *tmp;
  handle hVar4;
  long lVar5;
  list l;
  object value_;
  handle local_30;
  object local_28;
  
  list::list((list *)&local_30,
             (long)(src->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(src->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 1);
  puVar1 = (src->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (src->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar1 != puVar2) {
    lVar5 = 0;
    do {
      hVar4.m_ptr = (PyObject *)PyLong_FromSize_t(*(undefined2 *)((long)puVar1 + lVar5));
      if (hVar4.m_ptr == (PyObject *)0x0) {
        local_28.super_handle.m_ptr = (handle)(handle)hVar4.m_ptr;
        object::~object(&local_28);
        hVar4.m_ptr = (PyObject *)0x0;
        goto LAB_001c4125;
      }
      local_28.super_handle.m_ptr = (handle)(PyObject *)0x0;
      *(PyObject **)((long)&((local_30.m_ptr[1].ob_type)->ob_base).ob_base.ob_refcnt + lVar5 * 4) =
           hVar4.m_ptr;
      object::~object(&local_28);
      lVar3 = lVar5 + 2;
      lVar5 = lVar5 + 2;
    } while ((pointer)((long)puVar1 + lVar3) != puVar2);
  }
  hVar4.m_ptr = local_30.m_ptr;
  local_30.m_ptr = (PyObject *)0x0;
LAB_001c4125:
  object::~object((object *)&local_30);
  return (handle)hVar4.m_ptr;
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        if (!std::is_lvalue_reference<T>::value)
            policy = return_value_policy_override<Value>::policy(policy);
        list l(src.size());
        size_t index = 0;
        for (auto &&value : src) {
            auto value_ = reinterpret_steal<object>(value_conv::cast(forward_like<T>(value), policy, parent));
            if (!value_)
                return handle();
            PyList_SET_ITEM(l.ptr(), (ssize_t) index++, value_.release().ptr()); // steals a reference
        }
        return l.release();
    }